

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * Qt::reset(QTextStream *stream)

{
  QTextStream::reset(stream);
  return stream;
}

Assistant:

QTextStream &reset(QTextStream &stream)
{
    stream.reset();
    return stream;
}